

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

ProStringList * __thiscall
QMap<ProString,_ProStringList>::operator[](QMap<ProString,_ProStringList> *this,ProString *key)

{
  bool bVar1;
  pointer ppVar2;
  ProString *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_ProString,_ProStringList>_>,_bool> pVar3;
  iterator i;
  QMap<ProString,_ProStringList> copy;
  map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>
  *in_stack_ffffffffffffff18;
  pair<const_ProString,_ProStringList> *in_stack_ffffffffffffff20;
  ProStringList *pPVar4;
  pair<const_ProString,_ProStringList> *this_00;
  pair<const_ProString,_ProStringList> local_90;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
          ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
                      *)in_stack_ffffffffffffff20);
  if (bVar1) {
    QMap((QMap<ProString,_ProStringList> *)in_stack_ffffffffffffff20,
         (QMap<ProString,_ProStringList> *)in_stack_ffffffffffffff18);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<ProString,_ProStringList> *)0x13adaf);
  }
  detach((QMap<ProString,_ProStringList> *)in_stack_ffffffffffffff20);
  local_28._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
                *)0x13add2);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>
       ::find(in_stack_ffffffffffffff18,(key_type *)0x13ade3);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
                *)0x13adf5);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>
       ::end(in_stack_ffffffffffffff18);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
                  *)0x13ae31);
    this_00 = &local_90;
    ProStringList::ProStringList((ProStringList *)0x13ae53);
    std::pair<const_ProString,_ProStringList>::pair<ProStringList,_true>
              (this_00,in_RSI,(ProStringList *)in_stack_ffffffffffffff20);
    pVar3 = std::
            map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>
            ::insert((map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>
                      *)in_RSI,in_stack_ffffffffffffff20);
    local_28._M_node = (_Base_ptr)pVar3.first._M_node;
    local_10 = pVar3.second;
    local_18 = local_28._M_node;
    std::pair<const_ProString,_ProStringList>::~pair(in_stack_ffffffffffffff20);
    ProStringList::~ProStringList((ProStringList *)0x13aec0);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_ProString,_ProStringList>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_ProString,_ProStringList>_> *)0x13aecd);
  pPVar4 = &ppVar2->second;
  ~QMap((QMap<ProString,_ProStringList> *)0x13aee3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pPVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }